

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConfigFlagsTable.h
# Opt level: O0

bool __thiscall Js::RangeBase<int>::InRange(RangeBase<int> *this,int n)

{
  bool bVar1;
  int n_local;
  RangeBase<int> *this_local;
  
  bVar1 = SListBase<Js::RangeUnit<int>,_Memory::NoCheckHeapAllocator,_RealCount>::Empty
                    ((SListBase<Js::RangeUnit<int>,_Memory::NoCheckHeapAllocator,_RealCount> *)this)
  ;
  if (bVar1) {
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ =
         SListBase<Js::RangeUnit<int>,Memory::NoCheckHeapAllocator,RealCount>::
         MapUntil<Js::RangeBase<int>::InRange(int)::_lambda(Js::RangeUnit<int>const&)_1_>
                   ((SListBase<Js::RangeUnit<int>,Memory::NoCheckHeapAllocator,RealCount> *)this,
                    (anon_class_4_1_54a3980e)n);
  }
  return this_local._7_1_;
}

Assistant:

bool RangeBase<TRangeUnitData>::InRange(TRangeUnitData n)
{
    if (range.Empty())
    {
        return true;
    }
    else
    {
        return range.MapUntil([n](RangeUnit<TRangeUnitData> const& unit)
        {
            return RangeUnitContains(unit, n);
        });
    }
}